

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O2

Moves * __thiscall Position::GetCaptures(Position *this)

{
  pointer pMVar1;
  Move *move;
  pointer __x;
  
  if ((this->m_Captures).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_Captures).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __x = (this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
          super__Vector_impl_data._M_start;
    pMVar1 = (this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (__x == pMVar1) {
      GenerateMoves(this);
      __x = (this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
            super__Vector_impl_data._M_start;
      pMVar1 = (this->m_Moves).m_Moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    for (; (__x != pMVar1 && (0 < __x->m_Score)); __x = __x + 1) {
      std::vector<Move,_std::allocator<Move>_>::push_back(&(this->m_Captures).m_Moves,__x);
    }
  }
  return &this->m_Captures;
}

Assistant:

const Moves &GetCaptures()
    {
        if ( m_Captures.IsEmpty() )
        {
            if ( m_Moves.IsEmpty() )
                GenerateMoves();

            for ( auto &move : m_Moves )
            {
                if ( move.Score() > 0 )
                    m_Captures.Add( move );
                else
                    break;
            }
        }

        return m_Captures;
    }